

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O1

int Bits::Log2Floor_Portable(uint32 n)

{
  byte bVar1;
  int iVar2;
  int i;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  if (n == 0) {
    return -1;
  }
  iVar3 = 4;
  iVar2 = 0;
  do {
    uVar4 = 1 << ((byte)iVar3 & 0x1f);
    bVar1 = (byte)uVar4 & 0x1f;
    uVar5 = n >> bVar1;
    uVar6 = uVar5;
    if (n >> bVar1 != 0) {
      uVar6 = uVar4;
      n = uVar5;
    }
    iVar2 = iVar2 + uVar6;
    bVar7 = iVar3 != 0;
    iVar3 = iVar3 + -1;
  } while (bVar7);
  if (n != 1) {
    __assert_fail("value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/bits/bits.cc"
                  ,0x57,"static int Bits::Log2Floor_Portable(uint32)");
  }
  return iVar2;
}

Assistant:

int Bits::Log2Floor_Portable(uint32 n) {
  if (n == 0)
    return -1;
  int log = 0;
  uint32 value = n;
  for (int i = 4; i >= 0; --i) {
    int shift = (1 << i);
    uint32 x = value >> shift;
    if (x != 0) {
      value = x;
      log += shift;
    }
  }
  assert(value == 1);
  return log;
}